

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O1

int lws_cache_results_walk(lws_cache_results_t *walk_ctx)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (walk_ctx->size != 0) {
    uVar1 = lws_ser_ru32be(walk_ctx->ptr);
    walk_ctx->payload_len = (ulong)uVar1;
    uVar1 = lws_ser_ru32be(walk_ctx->ptr + 4);
    uVar2 = (ulong)uVar1;
    walk_ctx->tag_len = uVar2;
    walk_ctx->tag = walk_ctx->ptr + 8;
    walk_ctx->ptr = walk_ctx->ptr + uVar2 + 9;
    walk_ctx->size = (walk_ctx->size - uVar2) - 9;
    return 0;
  }
  return 1;
}

Assistant:

int
lws_cache_results_walk(lws_cache_results_t *walk_ctx)
{
	if (!walk_ctx->size)
		return 1;

	walk_ctx->payload_len = lws_ser_ru32be(walk_ctx->ptr);
	walk_ctx->tag_len = lws_ser_ru32be(walk_ctx->ptr + 4);
	walk_ctx->tag = walk_ctx->ptr + 8;

	walk_ctx->ptr += walk_ctx->tag_len + 1 + 8;
	walk_ctx->size -= walk_ctx->tag_len + 1 + 8;

	return 0;
}